

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

uint16_t gravity_function_cpool_add(gravity_vm *vm,gravity_function_t *f,gravity_value_t v)

{
  gravity_object_t *pgVar1;
  size_t sVar2;
  _Bool _Var3;
  void *pvVar4;
  undefined8 *puVar5;
  size_t local_58;
  gravity_value_t v2;
  size_t i;
  size_t n;
  gravity_function_t *f_local;
  gravity_vm *vm_local;
  gravity_value_t v_local;
  
  if (f->tag != EXEC_TYPE_NATIVE) {
    __assert_fail("f->tag == EXEC_TYPE_NATIVE",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/shared/gravity_value.c"
                  ,0x20e,
                  "uint16_t gravity_function_cpool_add(gravity_vm *, gravity_function_t *, gravity_value_t)"
                 );
  }
  pgVar1 = (gravity_object_t *)(f->field_9).field_0.cpool.n;
  v2.field_1.n = 0;
  while( true ) {
    if (pgVar1 <= v2.field_1.p) {
      if ((vm != (gravity_vm *)0x0) && (_Var3 = gravity_value_isobject(v), _Var3)) {
        gravity_vm_transfer(vm,v.field_1.p);
      }
      if ((f->field_9).field_0.cpool.n == (f->field_9).field_0.cpool.m) {
        if ((f->field_9).field_0.cpool.m == 0) {
          local_58 = 8;
        }
        else {
          local_58 = (f->field_9).field_0.cpool.m << 1;
        }
        (f->field_9).field_0.cpool.m = local_58;
        pvVar4 = realloc((f->field_9).field_2.special[1],(f->field_9).field_0.cpool.m << 4);
        (f->field_9).field_2.special[1] = pvVar4;
      }
      pvVar4 = (f->field_9).field_2.special[1];
      sVar2 = (f->field_9).field_0.cpool.n;
      (f->field_9).internal = (gravity_c_internal)(sVar2 + 1);
      puVar5 = (undefined8 *)((long)pvVar4 + sVar2 * 0x10);
      *puVar5 = v.isa;
      ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)(puVar5 + 1))->p =
           (gravity_object_t *)v.field_1;
      return (short)(f->field_9).field_0.cpool.n - 1;
    }
    _Var3 = gravity_value_equals
                      (v,*(gravity_value_t *)
                          ((long)(f->field_9).field_2.special[1] + v2.field_1.n * 0x10));
    if (_Var3) break;
    v2.field_1.p = (gravity_object_t *)((long)&(v2.field_1.p)->isa + 1);
  }
  gravity_value_free((gravity_vm *)0x0,v);
  return (uint16_t)v2.field_1.n;
}

Assistant:

uint16_t gravity_function_cpool_add (gravity_vm *vm, gravity_function_t *f, gravity_value_t v) {
    assert(f->tag == EXEC_TYPE_NATIVE);

    size_t n = marray_size(f->cpool);
    for (size_t i=0; i<n; i++) {
        gravity_value_t v2 = marray_get(f->cpool, i);
        if (gravity_value_equals(v,v2)) {
            gravity_value_free(NULL, v);
            return (uint16_t)i;
        }
    }

    // vm is required here because I cannot know in advance if v is already in the pool or not
    // and value object v must be added to the VM only once
    if ((vm) && (gravity_value_isobject(v))) gravity_vm_transfer(vm, VALUE_AS_OBJECT(v));

    marray_push(gravity_value_t, f->cpool, v);
    return (uint16_t)marray_size(f->cpool)-1;
}